

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O2

void P_FreeStrifeConversations(void)

{
  FStrifeDialogueNode *this;
  bool bVar1;
  
  while (StrifeDialogues.Count != 0) {
    StrifeDialogues.Count = StrifeDialogues.Count - 1;
    this = StrifeDialogues.Array[StrifeDialogues.Count];
    if (this != (FStrifeDialogueNode *)0x0) {
      FStrifeDialogueNode::~FStrifeDialogueNode(this);
    }
    operator_delete(this,0x50);
  }
  TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::Clear(&DialogueRoots,1);
  TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::Clear(&ClassRoots,1);
  PrevNode = (FStrifeDialogueNode *)0x0;
  if (DMenu::CurrentMenu != (DMenu *)0x0) {
    bVar1 = DObject::IsKindOf(&DMenu::CurrentMenu->super_DObject,
                              DConversationMenu::RegistrationInfo.MyClass);
    if (bVar1) {
      (*(DMenu::CurrentMenu->super_DObject)._vptr_DObject[0xd])();
      return;
    }
  }
  return;
}

Assistant:

void P_FreeStrifeConversations ()
{
	FStrifeDialogueNode *node;

	while (StrifeDialogues.Pop (node))
	{
		delete node;
	}

	DialogueRoots.Clear();
	ClassRoots.Clear();

	PrevNode = NULL;
	if (DMenu::CurrentMenu != NULL && DMenu::CurrentMenu->IsKindOf(RUNTIME_CLASS(DConversationMenu)))
	{
		DMenu::CurrentMenu->Close();
	}
}